

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_service_client(t_ocaml_generator *this,t_service *tservice)

{
  pointer *this_00;
  t_function *ptVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  t_service *ptVar5;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar6;
  t_struct *this_01;
  members_type *this_02;
  string *psVar7;
  t_type *ptVar8;
  size_type sVar9;
  reference pptVar10;
  char *pcVar11;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_718
  ;
  t_field **local_710;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_708
  ;
  const_iterator x_iter;
  string local_6e0;
  string local_6c0;
  members_type *local_6a0;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_688 [8];
  string res;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  allocator local_5a1;
  string local_5a0;
  string local_580;
  string local_560;
  allocator local_539;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  t_function recv_function;
  t_struct noargs;
  undefined1 local_370 [8];
  string resultname;
  string local_330;
  string local_310;
  string local_2f0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_2d0
  ;
  t_field **local_2c8;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  string argsname;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_198
  ;
  t_field **local_190;
  string local_188;
  string local_168;
  string local_148;
  allocator local_121;
  string local_120;
  string local_100;
  string local_e0 [8];
  string funname;
  const_iterator fld_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_a0;
  t_function **local_98;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_90;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  allocator local_39;
  string local_38 [8];
  string extends;
  t_service *tservice_local;
  t_ocaml_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"class client (iprot : Protocol.t) (oprot : Protocol.t) =");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"object (self)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_i_);
  poVar4 = std::operator<<(poVar4,"class client : Protocol.t -> Protocol.t -> ");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"object");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  ptVar5 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar5 != (t_service *)0x0) {
    ptVar5 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    type_name_abi_cxx11_
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,this,&ptVar5->super_t_type);
    this_00 = &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::operator=(local_38,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"inherit ");
    poVar4 = std::operator<<(poVar4,local_38);
    poVar4 = std::operator<<(poVar4,".client iprot oprot as super");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_i_);
    poVar4 = std::operator<<(poVar4,"inherit ");
    poVar4 = std::operator<<(poVar4,local_38);
    poVar4 = std::operator<<(poVar4,".client");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"val mutable seqid = 0");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_90);
  local_a0._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_98,&local_a0);
  local_90._M_current = local_98;
  while( true ) {
    arg_struct = (t_struct *)
                 std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                           ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar2 = __gnu_cxx::operator!=
                      (&local_90,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&arg_struct);
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    this_01 = t_function::get_arglist(*pptVar6);
    this_02 = t_struct::get_members(this_01);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       *)((long)&funname.field_2 + 8));
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string(local_e0,(string *)psVar7);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"method ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    ptVar1 = *pptVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"",&local_121);
    function_signature(&local_100,this,ptVar1,&local_120);
    poVar4 = std::operator<<(poVar4,(string *)&local_100);
    poVar4 = std::operator<<(poVar4," = ");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_i_);
    poVar4 = std::operator<<(poVar4,"method ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string((string *)&local_168,(string *)psVar7);
    t_generator::decapitalize(&local_148,(t_generator *)this,&local_168);
    poVar4 = std::operator<<(poVar4,(string *)&local_148);
    poVar4 = std::operator<<(poVar4," : ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    function_type_abi_cxx11_(&local_188,this,*pptVar6,true,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_188);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"self#send_");
    std::operator<<(poVar4,local_e0);
    local_190 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_02);
    funname.field_2._8_8_ = local_190;
    while( true ) {
      local_198._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_02);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&funname.field_2 + 8),&local_198);
      if (!bVar2) break;
      poVar4 = std::operator<<((ostream *)&this->f_service_," ");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)((long)&funname.field_2 + 8));
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
      std::__cxx11::string::string((string *)&local_1d8,(string *)psVar7);
      t_generator::decapitalize(&local_1b8,(t_generator *)this,&local_1d8);
      std::operator<<(poVar4,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&funname.field_2 + 8));
    }
    poVar4 = std::operator<<((ostream *)&this->f_service_,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    bVar2 = t_function::is_oneway(*pptVar6);
    if (!bVar2) {
      t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
      std::operator<<((ostream *)&this->f_service_,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      poVar4 = std::operator<<((ostream *)&this->f_service_,"self#recv_");
      poVar4 = std::operator<<(poVar4,local_e0);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"method private send_");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    ptVar1 = *pptVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,"",(allocator *)(argsname.field_2._M_local_buf + 0xf));
    function_signature(&local_218,this,ptVar1,&local_238);
    poVar4 = std::operator<<(poVar4,(string *)&local_218);
    poVar4 = std::operator<<(poVar4," = ");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)(argsname.field_2._M_local_buf + 0xf));
    t_generator::indent_up((t_generator *)this);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::operator+(&local_280,psVar7,"_args");
    t_generator::decapitalize((string *)local_260,(t_generator *)this,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2a0);
    poVar4 = std::operator<<(poVar4,"oprot#writeMessageBegin (\"");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,"\", ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    bVar2 = t_function::is_oneway(*pptVar6);
    pcVar11 = "Protocol.CALL";
    if (bVar2) {
      pcVar11 = "Protocol.ONEWAY";
    }
    poVar4 = std::operator<<(poVar4,pcVar11);
    poVar4 = std::operator<<(poVar4,", seqid);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2a0);
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2c0);
    poVar4 = std::operator<<(poVar4,"let args = new ");
    poVar4 = std::operator<<(poVar4,(string *)local_260);
    poVar4 = std::operator<<(poVar4," in");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2c0);
    t_generator::indent_up((t_generator *)this);
    local_2c8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_02);
    funname.field_2._8_8_ = local_2c8;
    while( true ) {
      local_2d0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_02);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&funname.field_2 + 8),&local_2d0);
      if (!bVar2) break;
      t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2f0);
      poVar4 = std::operator<<(poVar4,"args#set_");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)((long)&funname.field_2 + 8));
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar4 = std::operator<<(poVar4,(string *)psVar7);
      poVar4 = std::operator<<(poVar4," ");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)((long)&funname.field_2 + 8));
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar4 = std::operator<<(poVar4,(string *)psVar7);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2f0);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&funname.field_2 + 8));
    }
    t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_310);
    poVar4 = std::operator<<(poVar4,"args#write oprot;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_330);
    poVar4 = std::operator<<(poVar4,"oprot#writeMessageEnd;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)((long)&resultname.field_2 + 8),(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"oprot#getTransport#flush");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(resultname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_down((t_generator *)this);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_90);
    bVar2 = t_function::is_oneway(*pptVar6);
    if (!bVar2) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &noargs.xsd_all_,psVar7,"_result");
      t_generator::decapitalize((string *)local_370,(t_generator *)this,(string *)&noargs.xsd_all_);
      std::__cxx11::string::~string((string *)&noargs.xsd_all_);
      t_struct::t_struct((t_struct *)&recv_function.own_xceptions_,
                         (this->super_t_oop_generator).super_t_generator.program_);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      ptVar8 = t_function::get_returntype(*pptVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_538,"recv_",&local_539);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
      std::operator+(&local_518,&local_538,psVar7);
      t_function::t_function
                ((t_function *)local_4f8,ptVar8,&local_518,(t_struct *)&recv_function.own_xceptions_
                 ,false);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator((allocator<char> *)&local_539);
      t_generator::indent_abi_cxx11_(&local_560,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_560);
      poVar4 = std::operator<<(poVar4,"method private ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5a0,"",&local_5a1);
      function_signature(&local_580,this,(t_function *)local_4f8,&local_5a0);
      poVar4 = std::operator<<(poVar4,(string *)&local_580);
      poVar4 = std::operator<<(poVar4," =");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
      std::__cxx11::string::~string((string *)&local_560);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_5c8,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_5c8);
      poVar4 = std::operator<<(poVar4,"let (fname, mtype, rseqid) = iprot#readMessageBegin in");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5c8);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_5e8,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_5e8);
      poVar4 = std::operator<<(poVar4,"(if mtype = Protocol.EXCEPTION then");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_608,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_608);
      poVar4 = std::operator<<(poVar4,"  let x = Application_Exn.read iprot in");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_5e8);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_628,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_628);
      poVar4 = std::operator<<(poVar4,"  (iprot#readMessageEnd;");
      t_generator::indent_abi_cxx11_(&local_648,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_648);
      poVar4 = std::operator<<(poVar4,"   raise (Application_Exn.E x))");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_628);
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_abi_cxx11_((string *)((long)&res.field_2 + 8),(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)(res.field_2._M_local_buf + 8)
                              );
      poVar4 = std::operator<<(poVar4,"else ());");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)(res.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_688,"_",(allocator *)((long)&xs + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&xs + 7));
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      xceptions = (vector<t_field_*,_std::allocator<t_field_*>_> *)
                  t_function::get_xceptions(*pptVar6);
      local_6a0 = t_struct::get_members((t_struct *)xceptions);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      ptVar8 = t_function::get_returntype(*pptVar6);
      uVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if (((uVar3 & 1) == 0) ||
         (sVar9 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(local_6a0), sVar9 != 0))
      {
        std::__cxx11::string::operator=(local_688,"result");
      }
      t_generator::indent_abi_cxx11_(&local_6c0,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_6c0);
      poVar4 = std::operator<<(poVar4,"let ");
      poVar4 = std::operator<<(poVar4,local_688);
      poVar4 = std::operator<<(poVar4," = read_");
      poVar4 = std::operator<<(poVar4,(string *)local_370);
      poVar4 = std::operator<<(poVar4," iprot in");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_6c0);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_6e0,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_6e0);
      poVar4 = std::operator<<(poVar4,"iprot#readMessageEnd;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_6e0);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      ptVar8 = t_function::get_returntype(*pptVar6);
      uVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        t_generator::indent_abi_cxx11_((string *)&x_iter,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&x_iter);
        poVar4 = std::operator<<(poVar4,"match result#get_success with Some v -> v | None -> (");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&x_iter);
        t_generator::indent_up((t_generator *)this);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_708);
      local_710 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(local_6a0);
      local_708._M_current = local_710;
      while( true ) {
        local_718._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(local_6a0);
        bVar2 = __gnu_cxx::operator!=(&local_708,&local_718);
        if (!bVar2) break;
        t_generator::indent_abi_cxx11_(&local_738,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_738);
        poVar4 = std::operator<<(poVar4,"(match result#get_");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_708);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," with None -> () | Some _v ->");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_738);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"  raise (");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_708);
        ptVar8 = t_field::get_type(*pptVar10);
        type_name_abi_cxx11_(&local_778,this,ptVar8);
        t_generator::capitalize(&local_758,(t_generator *)this,&local_778);
        poVar4 = std::operator<<(poVar4,(string *)&local_758);
        poVar4 = std::operator<<(poVar4," _v));");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)&local_778);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_708);
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      ptVar8 = t_function::get_returntype(*pptVar6);
      uVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if ((uVar3 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_798,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_798);
        poVar4 = std::operator<<(poVar4,
                                 "raise (Application_Exn.E (Application_Exn.create Application_Exn.MISSING_RESULT \""
                                );
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_90);
        psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," failed: unknown result\")))");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_798);
        t_generator::indent_down((t_generator *)this);
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"()");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_down((t_generator *)this);
      std::__cxx11::string::~string(local_688);
      t_function::~t_function((t_function *)local_4f8);
      t_struct::~t_struct((t_struct *)&recv_function.own_xceptions_);
      std::__cxx11::string::~string((string *)local_370);
    }
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string(local_e0);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_90);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"end");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_i_);
  poVar4 = std::operator<<(poVar4,"end");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_ocaml_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  indent(f_service_) << "class client (iprot : Protocol.t) (oprot : Protocol.t) =" << endl
                     << "object (self)" << endl;
  indent(f_service_i_) << "class client : Protocol.t -> Protocol.t -> " << endl << "object" << endl;
  indent_up();

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    indent(f_service_) << "inherit " << extends << ".client iprot oprot as super" << endl;
    indent(f_service_i_) << "inherit " << extends << ".client" << endl;
  }
  indent(f_service_) << "val mutable seqid = 0" << endl;

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* arg_struct = (*f_iter)->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string funname = (*f_iter)->get_name();

    // Open function
    indent(f_service_) << "method " << function_signature(*f_iter) << " = " << endl;
    indent(f_service_i_) << "method " << decapitalize((*f_iter)->get_name()) << " : "
                         << function_type(*f_iter, true, false) << endl;
    indent_up();
    indent(f_service_) << "self#send_" << funname;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << " " << decapitalize((*fld_iter)->get_name());
    }
    f_service_ << ";" << endl;

    if (!(*f_iter)->is_oneway()) {
      f_service_ << indent();
      f_service_ << "self#recv_" << funname << endl;
    }
    indent_down();

    indent(f_service_) << "method private send_" << function_signature(*f_iter) << " = " << endl;
    indent_up();

    std::string argsname = decapitalize((*f_iter)->get_name() + "_args");

    // Serialize the request header
    f_service_ << indent() << "oprot#writeMessageBegin (\"" << (*f_iter)->get_name() << "\", "
               << ((*f_iter)->is_oneway() ? "Protocol.ONEWAY" : "Protocol.CALL") << ", seqid);"
               << endl;

    f_service_ << indent() << "let args = new " << argsname << " in" << endl;
    indent_up();

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args#set_" << (*fld_iter)->get_name() << " "
                 << (*fld_iter)->get_name() << ";" << endl;
    }

    // Write to the stream
    f_service_ << indent() << "args#write oprot;" << endl << indent() << "oprot#writeMessageEnd;"
               << endl << indent() << "oprot#getTransport#flush" << endl;

    indent_down();
    indent_down();

    if (!(*f_iter)->is_oneway()) {
      std::string resultname = decapitalize((*f_iter)->get_name() + "_result");
      t_struct noargs(program_);

      t_function recv_function((*f_iter)->get_returntype(),
                               string("recv_") + (*f_iter)->get_name(),
                               &noargs);
      // Open function
      f_service_ << indent() << "method private " << function_signature(&recv_function) << " ="
                 << endl;
      indent_up();

      // TODO(mcslee): Validate message reply here, seq ids etc.

      f_service_ << indent() << "let (fname, mtype, rseqid) = iprot#readMessageBegin in" << endl;
      indent_up();
      f_service_ << indent() << "(if mtype = Protocol.EXCEPTION then" << endl << indent()
                 << "  let x = Application_Exn.read iprot in" << endl;
      indent_up();
      f_service_ << indent() << "  (iprot#readMessageEnd;" << indent()
                 << "   raise (Application_Exn.E x))" << endl;
      indent_down();
      f_service_ << indent() << "else ());" << endl;
      string res = "_";

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();

      if (!(*f_iter)->get_returntype()->is_void() || xceptions.size() > 0) {
        res = "result";
      }
      f_service_ << indent() << "let " << res << " = read_" << resultname << " iprot in" << endl;
      indent_up();
      f_service_ << indent() << "iprot#readMessageEnd;" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "match result#get_success with Some v -> v | None -> (" << endl;
        indent_up();
      }

      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        f_service_ << indent() << "(match result#get_" << (*x_iter)->get_name()
                   << " with None -> () | Some _v ->" << endl;
        indent(f_service_) << "  raise (" << capitalize(type_name((*x_iter)->get_type()))
                           << " _v));" << endl;
      }

      // Careful, only return _result if not a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "()" << endl;
      } else {
        f_service_
            << indent()
            << "raise (Application_Exn.E (Application_Exn.create Application_Exn.MISSING_RESULT \""
            << (*f_iter)->get_name() << " failed: unknown result\")))" << endl;
        indent_down();
      }

      // Close function
      indent_down();
      indent_down();
      indent_down();
    }
  }

  indent_down();
  indent(f_service_) << "end" << endl << endl;
  indent(f_service_i_) << "end" << endl << endl;
}